

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

Interval __thiscall pbrt::Interval::operator/(Interval *this,Interval i)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  bool bVar1;
  Interval in_RDI;
  float low;
  undefined1 in_ZMM0 [64];
  Float highQuot [4];
  Float lowQuot [4];
  Float in_stack_ffffffffffffff68;
  Float in_stack_ffffffffffffff6c;
  Float local_88;
  Float local_84;
  Float local_80;
  Float local_7c;
  Float *local_78;
  undefined8 local_70;
  Float local_68;
  Float local_64;
  Float local_60;
  Float local_5c;
  Float *local_58;
  undefined8 local_50;
  Float local_48;
  Float local_44;
  Float local_40;
  Float local_3c;
  Float local_38;
  Float local_34;
  Float local_30;
  Float local_2c;
  undefined8 local_20;
  undefined8 local_10;
  Interval local_8;
  
  local_20 = vmovlpd_avx(in_ZMM0._0_16_);
  local_10 = local_20;
  bVar1 = InRange(in_stack_ffffffffffffff6c,in_RDI);
  if (bVar1) {
    Interval((Interval *)in_RDI,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  }
  else {
    local_38 = DivRoundDown(0.0,1.010825e-38);
    local_34 = DivRoundDown(0.0,1.0108292e-38);
    local_30 = DivRoundDown(0.0,1.0108332e-38);
    local_2c = DivRoundDown(0.0,1.0108374e-38);
    local_48 = DivRoundUp(0.0,1.0108415e-38);
    local_44 = DivRoundUp(0.0,1.0108457e-38);
    local_40 = DivRoundUp(0.0,1.0108498e-38);
    local_3c = DivRoundUp(0.0,1.010854e-38);
    local_68 = local_38;
    local_64 = local_34;
    local_60 = local_30;
    local_5c = local_2c;
    local_58 = &local_68;
    local_50 = 4;
    __l._M_array._4_4_ = in_stack_ffffffffffffff6c;
    __l._M_array._0_4_ = in_stack_ffffffffffffff68;
    __l._M_len._0_4_ = in_RDI.low;
    __l._M_len._4_4_ = in_RDI.high;
    low = std::min<float>(__l);
    local_88 = local_48;
    local_84 = local_44;
    local_80 = local_40;
    local_7c = local_3c;
    local_78 = &local_88;
    local_70 = 4;
    __l_00._M_array._4_4_ = low;
    __l_00._M_array._0_4_ = in_stack_ffffffffffffff68;
    __l_00._M_len._0_4_ = in_RDI.low;
    __l_00._M_len._4_4_ = in_RDI.high;
    std::max<float>(__l_00);
    Interval((Interval *)in_RDI,low,in_stack_ffffffffffffff68);
  }
  return local_8;
}

Assistant:

PBRT_CPU_GPU inline Interval Interval::operator/(Interval i) const {
    if (InRange(0, i))
        // The interval we're dividing by straddles zero, so just
        // return an interval of everything.
        return Interval(-Infinity, Infinity);

    Float lowQuot[4] = {DivRoundDown(low, i.low), DivRoundDown(high, i.low),
                        DivRoundDown(low, i.high), DivRoundDown(high, i.high)};
    Float highQuot[4] = {DivRoundUp(low, i.low), DivRoundUp(high, i.low),
                         DivRoundUp(low, i.high), DivRoundUp(high, i.high)};
    return {std::min({lowQuot[0], lowQuot[1], lowQuot[2], lowQuot[3]}),
            std::max({highQuot[0], highQuot[1], highQuot[2], highQuot[3]})};
}